

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void begin_suite::test_boolean(void)

{
  bool bVar1;
  const_iterator local_138;
  const_iterator local_120;
  const_iterator local_108;
  const_iterator local_f0;
  undefined1 local_d8 [8];
  variable data_1;
  const_iterator local_90;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator!=
                    (&local_50,&local_78);
  boost::detail::test_impl
            ("data.begin() != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x10e,"void begin_suite::test_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::cbegin
            (&local_90,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::cend
            ((const_iterator *)&data_1.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    (&local_90,(const_iterator *)&data_1.storage.field_0x28);
  boost::detail::test_impl
            ("data.cbegin() != data.cend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x10f,"void begin_suite::test_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_90);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_d8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_108,(basic_variable<std::allocator<char>_> *)local_d8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    (&local_f0,&local_108);
  boost::detail::test_impl
            ("data.begin() != data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x113,"void begin_suite::test_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_108)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::cbegin
            (&local_120,(basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::cend
            (&local_138,(basic_variable<std::allocator<char>_> *)local_d8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                    (&local_120,&local_138);
  boost::detail::test_impl
            ("data.cbegin() != data.cend()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x114,"void begin_suite::test_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_138)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_120)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  return;
}

Assistant:

void test_boolean()
{
    {
        variable data(true);
        TRIAL_PROTOCOL_TEST(data.begin() != data.end());
        TRIAL_PROTOCOL_TEST(data.cbegin() != data.cend());
    }
    {
        const variable data(true);
        TRIAL_PROTOCOL_TEST(data.begin() != data.end());
        TRIAL_PROTOCOL_TEST(data.cbegin() != data.cend());
    }
}